

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O3

LPCUTF8 Js::CharClassifier::SkipIdentifierSurrogateStartEnd
                  (LPCUTF8 psz,LPCUTF8 end,CharClassifier *instance)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  char16 cVar5;
  codepoint_t cVar6;
  DecodeOptions local_3c;
  byte *pbStack_38;
  DecodeOptions options;
  LPCUTF8 currentPosition;
  
  local_3c = doAllowThreeByteSurrogates;
  if (psz < end) {
    pbStack_38 = psz + 1;
    bVar2 = *psz;
    uVar4 = (ushort)bVar2;
    if ((char)bVar2 < '\0') {
      cVar5 = utf8::DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,end,&local_3c,(bool *)0x0);
      cVar6 = (codepoint_t)(ushort)cVar5;
      if ((local_3c & doSecondSurrogatePair) != doDefault) {
        if (pbStack_38 < end) {
          pbVar1 = pbStack_38 + 1;
          bVar2 = *pbStack_38;
          cVar5 = (char16)bVar2;
          pbStack_38 = pbVar1;
          if ((char)bVar2 < '\0') {
            cVar5 = utf8::DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,end,&local_3c,
                                     (bool *)0x0);
          }
        }
        else {
          cVar5 = L'\0';
        }
        cVar6 = NumberUtilities::SurrogatePairAsCodePoint(cVar6,(uint)(ushort)cVar5);
      }
      goto LAB_00e5843f;
    }
  }
  else {
    uVar4 = 0;
    pbStack_38 = psz;
  }
  cVar6 = (codepoint_t)uVar4;
LAB_00e5843f:
  bVar3 = IsIdStart(instance,cVar6);
  if (bVar3) {
    do {
      psz = pbStack_38;
      if (end <= pbStack_38) {
        return pbStack_38;
      }
      pbVar1 = pbStack_38 + 1;
      bVar2 = *pbStack_38;
      cVar5 = (char16)bVar2;
      pbStack_38 = pbVar1;
      if ((char)bVar2 < '\0') {
        cVar5 = utf8::DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,end,&local_3c,(bool *)0x0);
      }
      if (cVar5 == L'\0') {
        return psz;
      }
      cVar6 = (codepoint_t)(ushort)cVar5;
      if ((local_3c & doSecondSurrogatePair) != doDefault) {
        if (pbStack_38 < end) {
          pbVar1 = pbStack_38 + 1;
          bVar2 = *pbStack_38;
          cVar5 = (char16)bVar2;
          pbStack_38 = pbVar1;
          if ((char)bVar2 < '\0') {
            cVar5 = utf8::DecodeTail((ushort)bVar2,&stack0xffffffffffffffc8,end,&local_3c,
                                     (bool *)0x0);
          }
        }
        else {
          cVar5 = L'\0';
        }
        cVar6 = NumberUtilities::SurrogatePairAsCodePoint(cVar6,(uint)(ushort)cVar5);
      }
      bVar3 = IsIdContinue(instance,cVar6);
    } while (bVar3);
  }
  return psz;
}

Assistant:

const LPCUTF8 Js::CharClassifier::SkipIdentifierSurrogateStartEnd(LPCUTF8 psz, LPCUTF8 end, const CharClassifier *instance)
{

    LPCUTF8 currentPosition = psz;
    utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

    // Similar reasoning to above, however we do have surrogate identifiers, but less likely to occur in code.
    codepoint_t currentChar = utf8::Decode(currentPosition, end, options);

    if (options & utf8::doSecondSurrogatePair)
    {
        currentChar = Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, utf8::Decode(currentPosition, end, options));
    }

    if (!instance->IsIdStart(currentChar))
    {
        return psz;
    }

    psz = currentPosition;

    // Slow path is to check for a surrogate each iteration.
    // There is no new surrogate whitespaces as of yet, however, might be in the future, so surrogates still need to be checked
    // So, based on that, best way is to hit the slow path if the current character is not a whitespace in [0, FFFF];
    while((currentChar = utf8::Decode(currentPosition, end, options)) != '\0')
    {
        if (options & utf8::doSecondSurrogatePair)
        {
            currentChar = Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, utf8::Decode(currentPosition, end, options));
        }

        if (!instance->IsIdContinue(currentChar))
        {
            return psz;
        }

        psz = currentPosition;
    }

    return psz;
}